

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestPipelineImpl::getAnyCap(TestPipelineImpl *this,GetAnyCapContext context)

{
  uint uVar1;
  TransformPromiseNodeBase *this_00;
  char *in_RCX;
  CallContextHook *in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  int in_R8D;
  Promise<void> PVar2;
  GetAnyCapContext context_local;
  Client cap;
  Own<kj::_::PromiseNode> local_f8;
  undefined1 local_e8 [56];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  Reader params;
  Own<kj::_::PromiseNode> local_48;
  Maybe<capnp::MessageSize> local_38;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  context_local.hook = in_RDX;
  CallContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,_capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>
  ::getParams(&params,&context_local);
  if (params._reader.dataSize < 0x20) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_00266e7c;
    uVar1 = 0;
  }
  else {
    uVar1 = *params._reader.data;
    if ((uVar1 == 0xea) ||
       (in_RCX = (char *)&kj::_::Debug::minSeverity, 2 < kj::_::Debug::minSeverity))
    goto LAB_00266e7c;
  }
  request.super_Builder._builder.segment._0_4_ = 0xea;
  in_RCX = "\"failed: expected \" \"(234) == (params.getN())\", 234, params.getN()";
  in_R8D = 0x2e8419;
  local_e8._0_4_ = uVar1;
  kj::_::Debug::log<char_const(&)[42],int,unsigned_int>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x3bf,ERROR,"\"failed: expected \" \"(234) == (params.getN())\", 234, params.getN()",
             (char (*) [42])"failed: expected (234) == (params.getN())",(int *)&request,
             (uint *)local_e8);
LAB_00266e7c:
  capnproto_test::capnp::test::TestPipeline::GetAnyCapParams::Reader::getInCap((Reader *)&cap);
  (*(context_local.hook)->_vptr_CallContextHook[1])();
  Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>((Client *)local_e8,&cap);
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&request,(Client *)local_e8,&local_38);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_e8 + 8));
  *(undefined4 *)request.super_Builder._builder.data = 0x7b;
  *(byte *)((long)request.super_Builder._builder.data + 4) =
       *(byte *)((long)request.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_e8,(int)&request,__buf,(size_t)in_RCX,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)local_e8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:969:7),_kj::_::PropagateException>
             ::anon_class_16_2_06e2585c_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_003951a8;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)context.hook;
  this_00[1].dependency.disposer = (Disposer *)context_local.hook;
  local_f8.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,capnp::_::TestPipelineImpl::getAnyCap(capnp::CallContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>)::$_0,kj::_::PropagateException>>
        ::instance;
  local_48.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,capnp::_::TestPipelineImpl::getAnyCap(capnp::CallContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>)::$_0,kj::_::PropagateException>>
        ::instance;
  local_f8.ptr = (PromiseNode *)0x0;
  (this->super_Server)._vptr_Server =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,capnp::_::TestPipelineImpl::getAnyCap(capnp::CallContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>)::$_0,kj::_::PropagateException>>
        ::instance;
  *(TransformPromiseNodeBase **)&(this->super_Server).field_0x8 = this_00;
  local_48.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode>::dispose(&local_48);
  kj::Own<kj::_::PromiseNode>::dispose(&local_f8);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)local_e8);
  kj::Own<capnp::RequestHook>::dispose(&request.hook);
  kj::Own<capnp::ClientHook>::dispose(&cap.hook);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestPipelineImpl::getAnyCap(GetAnyCapContext context) {
  ++callCount;

  auto params = context.getParams();
  EXPECT_EQ(234, params.getN());

  auto cap = params.getInCap();
  context.releaseParams();

  auto request = cap.castAs<test::TestInterface>().fooRequest();
  request.setI(123);
  request.setJ(true);

  return request.send().then(
      [this,KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
        EXPECT_EQ("foo", response.getX());

        auto result = context.getResults();
        result.setS("bar");
        result.initOutBox().setCap(kj::heap<TestExtendsImpl>(callCount));
      }